

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTimeCode.cpp
# Opt level: O2

void __thiscall Imf_3_4::TimeCode::setTimeAndFlags(TimeCode *this,uint value,Packing packing)

{
  uint uVar1;
  
  if (packing == FILM24_PACKING) {
    value = value & 0xffffff3f;
  }
  else if (packing == TV50_PACKING) {
    uVar1 = value & 0x40000000 |
            value << 8 & 0x80000000 | value << 8 & 0x800000 | value & 0x3f7f7fbf;
    this->_time = uVar1;
    if (-1 < (int)value) {
      return;
    }
    value = uVar1 | 0x8000;
  }
  this->_time = value;
  return;
}

Assistant:

void
TimeCode::setTimeAndFlags (unsigned int value, Packing packing)
{
    if (packing == TV50_PACKING)
    {
        _time =
            value & ~((1 << 6) | (1 << 15) | (1 << 23) | (1 << 30) | (1 << 31));

        if (value & (1 << 15)) setBgf0 (true);

        if (value & (1 << 23)) setBgf2 (true);

        if (value & (1 << 30)) setBgf1 (true);

        if (value & (1 << 31)) setFieldPhase (true);
    }
    else if (packing == FILM24_PACKING)
    {
        _time = value & ~((1 << 6) | (1 << 7));
    }
    else // packing == TV60_PACKING
    {
        _time = value;
    }
}